

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalNinjaGenerator::CloseRulesFileStream(cmGlobalNinjaGenerator *this)

{
  if (this->RulesFileStream != (cmGeneratedFileStream *)0x0) {
    (*(this->RulesFileStream->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.
      _vptr_basic_ostream[1])();
    this->RulesFileStream = (cmGeneratedFileStream *)0x0;
    return;
  }
  cmSystemTools::Error("Rules file stream was not open.",(char *)0x0,(char *)0x0,(char *)0x0);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::CloseRulesFileStream()
{
  if (this->RulesFileStream) {
    delete this->RulesFileStream;
    this->RulesFileStream = nullptr;
  } else {
    cmSystemTools::Error("Rules file stream was not open.");
  }
}